

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

diff_t __thiscall
absl::lts_20240722::time_internal::cctz::detail::difference
          (undefined8 param_1,int param_2,undefined8 param_3,int param_4)

{
  diff_t dVar1;
  
  dVar1 = difference();
  dVar1 = impl::scale_add(dVar1,0x3c,(long)((param_2 >> 0x18) - (param_4 >> 0x18)));
  return dVar1;
}

Assistant:

CONSTEXPR_F diff_t difference(minute_tag, fields f1, fields f2) noexcept {
  return impl::scale_add(difference(hour_tag{}, f1, f2), 60, (f1.mm - f2.mm));
}